

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# alert_manager.cpp
# Opt level: O0

void __thiscall libtorrent::aux::alert_manager::maybe_notify(alert_manager *this,alert *a)

{
  bool bVar1;
  int iVar2;
  value_type *this_00;
  __shared_ptr_access<libtorrent::plugin,_(__gnu_cxx::_Lock_policy)2,_false,_false> *this_01;
  element_type *peVar3;
  shared_ptr<libtorrent::plugin> *e;
  iterator __end2;
  iterator __begin2;
  list<std::shared_ptr<libtorrent::plugin>,_std::allocator<std::shared_ptr<libtorrent::plugin>_>_>
  *__range2;
  alert *a_local;
  alert_manager *this_local;
  
  this_00 = container_wrapper<libtorrent::heterogeneous_queue<libtorrent::alert>,_long,_std::array<libtorrent::heterogeneous_queue<libtorrent::alert>,_2UL>_>
            ::operator[](&this->m_alerts,(long)this->m_generation);
  iVar2 = heterogeneous_queue<libtorrent::alert>::size(this_00);
  if (iVar2 == 1) {
    bVar1 = ::std::function::operator_cast_to_bool((function *)&this->m_notify);
    if (bVar1) {
      ::std::function<void_()>::operator()(&this->m_notify);
    }
    ::std::_V2::condition_variable_any::notify_all(&this->m_condition);
  }
  __end2 = ::std::__cxx11::
           list<std::shared_ptr<libtorrent::plugin>,_std::allocator<std::shared_ptr<libtorrent::plugin>_>_>
           ::begin(&this->m_ses_extensions);
  e = (shared_ptr<libtorrent::plugin> *)
      ::std::__cxx11::
      list<std::shared_ptr<libtorrent::plugin>,_std::allocator<std::shared_ptr<libtorrent::plugin>_>_>
      ::end(&this->m_ses_extensions);
  while (bVar1 = ::std::operator!=(&__end2,(_Self *)&e), bVar1) {
    this_01 = (__shared_ptr_access<libtorrent::plugin,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
              ::std::_List_iterator<std::shared_ptr<libtorrent::plugin>_>::operator*(&__end2);
    peVar3 = ::std::
             __shared_ptr_access<libtorrent::plugin,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
             operator->(this_01);
    (*peVar3->_vptr_plugin[7])(peVar3,a);
    ::std::_List_iterator<std::shared_ptr<libtorrent::plugin>_>::operator++(&__end2);
  }
  return;
}

Assistant:

void alert_manager::maybe_notify(alert* a)
	{
		if (m_alerts[m_generation].size() == 1)
		{
			// we just posted to an empty queue. If anyone is waiting for
			// alerts, we need to notify them. Also (potentially) call the
			// user supplied m_notify callback to let the client wake up its
			// message loop to poll for alerts.
			if (m_notify) m_notify();

			// TODO: 2 keep a count of the number of threads waiting. Only if it's
			// > 0 notify them
			m_condition.notify_all();
		}

#ifndef TORRENT_DISABLE_EXTENSIONS
		for (auto& e : m_ses_extensions)
			e->on_alert(a);
#else
		TORRENT_UNUSED(a);
#endif
	}